

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O2

int detect_form(archive_read *a,int *is_form_d)

{
  byte bVar1;
  bool bVar2;
  ssize_t sVar3;
  int iVar4;
  byte *b;
  void *pvVar5;
  ssize_t sVar6;
  long lVar7;
  byte *pbVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  byte *pbVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  ulong uStack_70;
  int local_68;
  int local_64;
  ssize_t avail;
  byte *local_50;
  archive_read *local_48;
  ssize_t nl;
  ulong local_38;
  
  if (is_form_d != (int *)0x0) {
    *is_form_d = 0;
  }
  local_48 = a;
  b = (byte *)__archive_read_ahead(a,1,&avail);
  if (b == (byte *)0x0) {
    return -1;
  }
  local_64 = 0;
  iVar4 = 0;
  local_68 = 0;
  lVar14 = avail;
LAB_0050e753:
  local_50 = (byte *)CONCAT44(local_50._4_4_,iVar4);
  do {
    uVar15 = avail;
    if (avail == 0) {
      nl = 0;
      uStack_70 = 0;
    }
    else {
      uStack_70 = get_line_size((char *)b,avail,&nl);
    }
    bVar2 = false;
    while (nl == 0) {
      if ((bVar2) || (uVar15 != uStack_70)) goto LAB_0050eb8b;
      uVar13 = (ulong)((int)lVar14 + 0x3ffU & 0xfffffc00);
      pvVar5 = __archive_read_ahead(local_48,uVar13 << (uVar13 < lVar14 + 0xa0U),&avail);
      if (pvVar5 == (void *)0x0) {
        if (avail <= lVar14) {
          uStack_70 = 0;
          goto LAB_0050eb8b;
        }
        pvVar5 = __archive_read_ahead(local_48,avail,&avail);
        bVar2 = true;
      }
      else {
        bVar2 = false;
      }
      sVar3 = avail;
      b = (byte *)((long)pvVar5 + (lVar14 - uVar15));
      uVar13 = avail - (lVar14 - uVar15);
      avail = uVar13;
      sVar6 = get_line_size((char *)((long)pvVar5 + lVar14),uVar13 - uVar15,&nl);
      uStack_70 = 0;
      if (-1 < sVar6) {
        uStack_70 = uVar15;
      }
      uStack_70 = uStack_70 + sVar6;
      lVar14 = sVar3;
      uVar15 = uVar13;
    }
    if ((long)uStack_70 < 1) goto LAB_0050eb8b;
    uVar13 = ~nl;
    if ((int)local_50 != 0) {
      iVar4 = bid_keyword_list((char *)b,uStack_70,0,0);
      if (iVar4 < 1) goto LAB_0050ebc6;
      b = b + uStack_70;
      iVar4 = (int)local_50;
      if ((b[uVar13] != 0x5c) && (iVar4 = 0, (int)local_50 == 1)) {
        if (1 < local_64) goto LAB_0050eb9f;
        local_64 = local_64 + 1;
        iVar4 = 0;
      }
      avail = uVar15 - uStack_70;
      goto LAB_0050e753;
    }
    pbVar12 = b + uStack_70;
    pbVar8 = b + uVar13;
    uVar9 = uVar15;
    for (uVar11 = uStack_70; uVar9 = uVar9 - 1, 0 < (long)uVar11; uVar11 = uVar11 - 1) {
      bVar1 = *b;
      if ((bVar1 != 0x20) && (uStack_70 = uVar11, bVar1 != 9)) goto LAB_0050e896;
      b = b + 1;
      uVar15 = uVar15 - 1;
      pbVar8 = pbVar8 + 1;
      avail = uVar9;
    }
    bVar1 = *pbVar12;
    uStack_70 = 0;
    b = pbVar12;
LAB_0050e896:
    if (((bVar1 != 10) && (bVar1 != 0xd)) && (bVar1 != 0x23)) break;
    b = b + uStack_70;
    if ((long)uVar11 < 1) {
      uVar11 = 0;
    }
    avail = uVar15 - uVar11;
  } while( true );
  if (bVar1 != 0x2f) {
    lVar7 = -nl;
    local_50 = b + uStack_70;
    uVar9 = 0;
    if (0 < (long)uVar11) {
      uVar9 = uVar11;
    }
    bVar2 = true;
    for (pbVar12 = b; pbVar12 < local_50; pbVar12 = pbVar12 + 1) {
      bVar1 = *pbVar12;
      if (bid_entry_safe_char[bVar1] == '\0') {
        if ((0x20 < bVar1) || ((0x100002600U >> ((ulong)(uint)bVar1 & 0x3f) & 1) == 0))
        goto LAB_0050e9d9;
        break;
      }
      uVar9 = uVar9 - 1;
      bVar2 = false;
    }
    if (bVar2) {
LAB_0050e9d9:
      if ((((b <= local_50 + lVar7 + -2) && (local_50[lVar7 + -1] == 0x5c)) &&
          ((bVar1 = local_50[lVar7 + -2], bVar1 == 9 || (bVar1 == 0x20)))) ||
         ((b <= local_50 + lVar7 + -1 && (local_50[lVar7 + -1] == 0x5c)))) goto LAB_0050eb8b;
      lVar10 = 0;
      uVar9 = 0;
      if (0 < (long)uVar11) {
        uVar9 = uVar11;
      }
      bVar2 = false;
      for (pbVar8 = pbVar8 + uVar9 + ((long)uVar11 >> 0x3f & uVar11); b <= pbVar8;
          pbVar8 = pbVar8 + -1) {
        bVar1 = *pbVar8;
        if ((bVar1 == 9) || (bVar1 == 0x20)) break;
        if (bid_entry_safe_char[bVar1] == '\0') goto LAB_0050eb8b;
        if (bVar1 == 0x2f) {
          bVar2 = true;
        }
        lVar10 = lVar10 + 1;
      }
      if ((((int)lVar10 == 0) || (!bVar2)) || (pbVar8[1] == 0x2f)) goto LAB_0050eb8b;
      bVar2 = false;
      uVar9 = 0;
      if (0 < (long)uVar11) {
        uVar9 = uVar11;
      }
      uVar9 = (lVar7 + uVar9) - lVar10;
      iVar4 = 1;
      pbVar12 = b;
    }
    else {
      iVar4 = 0;
      bVar2 = true;
    }
    local_38 = uVar13;
    iVar4 = bid_keyword_list((char *)pbVar12,uVar9,0,iVar4);
    if (iVar4 < 0) goto LAB_0050eb8b;
    if (local_68 == 1) {
      if ((bool)(bVar2 & iVar4 != 0)) {
        local_68 = 1;
        goto LAB_0050eb8b;
      }
LAB_0050eb3a:
      if (bVar2) {
LAB_0050eb3f:
        if (local_50[local_38] == 0x5c) {
          iVar4 = 1;
          goto LAB_0050eb60;
        }
      }
    }
    else {
      if (local_68 != 0) goto LAB_0050eb3a;
      local_68 = 1;
      if (bVar2) {
        local_68 = -(uint)(iVar4 != 0);
        goto LAB_0050eb3f;
      }
    }
    if (1 < local_64) goto LAB_0050eb9f;
    local_64 = local_64 + 1;
    iVar4 = 0;
    goto LAB_0050eb60;
  }
  if (uStack_70 < 5) goto LAB_0050eb8b;
  iVar4 = strncmp((char *)b,"/set",4);
  if (iVar4 == 0) {
    pbVar12 = b + 4;
    lVar7 = uStack_70 - 4;
    iVar4 = 0;
LAB_0050eb01:
    iVar4 = bid_keyword_list((char *)pbVar12,lVar7,iVar4,0);
    if (0 < iVar4) {
      iVar4 = (uint)(b[uVar13 + uStack_70] == 0x5c) * 2;
LAB_0050eb60:
      b = b + uStack_70;
      if ((long)uVar11 < 1) {
        uVar11 = 0;
      }
      avail = uVar15 - uVar11;
      goto LAB_0050e753;
    }
  }
  else if ((6 < uStack_70) && (iVar4 = strncmp((char *)b,"/unset",6), iVar4 == 0)) {
    pbVar12 = b + 6;
    lVar7 = uStack_70 - 6;
    iVar4 = 1;
    goto LAB_0050eb01;
  }
LAB_0050ebc6:
  uStack_70 = 1;
LAB_0050eb8b:
  if (local_64 < 3) {
    if (local_64 < 1) {
      return 0;
    }
    if (uStack_70 != 0) {
      return 0;
    }
  }
LAB_0050eb9f:
  if ((is_form_d != (int *)0x0) && (local_68 == 1)) {
    *is_form_d = 1;
  }
  return 0x20;
}

Assistant:

static int
detect_form(struct archive_read *a, int *is_form_d)
{
	const char *p;
	ssize_t avail, ravail;
	ssize_t detected_bytes = 0, len, nl;
	int entry_cnt = 0, multiline = 0;
	int form_D = 0;/* The archive is generated by `NetBSD mtree -D'
			* (In this source we call it `form D') . */

	if (is_form_d != NULL)
		*is_form_d = 0;
	p = __archive_read_ahead(a, 1, &avail);
	if (p == NULL)
		return (-1);
	ravail = avail;
	for (;;) {
		len = next_line(a, &p, &avail, &ravail, &nl);
		/* The terminal character of the line should be
		 * a new line character, '\r\n' or '\n'. */
		if (len <= 0 || nl == 0)
			break;
		if (!multiline) {
			/* Leading whitespace is never significant,
			 * ignore it. */
			while (len > 0 && (*p == ' ' || *p == '\t')) {
				++p;
				--avail;
				--len;
			}
			/* Skip comment or empty line. */ 
			if (p[0] == '#' || p[0] == '\n' || p[0] == '\r') {
				p += len;
				avail -= len;
				continue;
			}
		} else {
			/* A continuance line; the terminal
			 * character of previous line was '\' character. */
			if (bid_keyword_list(p, len, 0, 0) <= 0)
				break;
			if (multiline == 1)
				detected_bytes += len;
			if (p[len-nl-1] != '\\') {
				if (multiline == 1 &&
				    ++entry_cnt >= MAX_BID_ENTRY)
					break;
				multiline = 0;
			}
			p += len;
			avail -= len;
			continue;
		}
		if (p[0] != '/') {
			int last_is_path, keywords;

			keywords = bid_entry(p, len, nl, &last_is_path);
			if (keywords >= 0) {
				detected_bytes += len;
				if (form_D == 0) {
					if (last_is_path)
						form_D = 1;
					else if (keywords > 0)
						/* This line is not `form D'. */
						form_D = -1;
				} else if (form_D == 1) {
					if (!last_is_path && keywords > 0)
						/* This this is not `form D'
						 * and We cannot accept mixed
						 * format. */
						break;
				}
				if (!last_is_path && p[len-nl-1] == '\\')
					/* This line continues. */
					multiline = 1;
				else {
					/* We've got plenty of correct lines
					 * to assume that this file is a mtree
					 * format. */
					if (++entry_cnt >= MAX_BID_ENTRY)
						break;
				}
			} else
				break;
		} else if (len > 4 && strncmp(p, "/set", 4) == 0) {
			if (bid_keyword_list(p+4, len-4, 0, 0) <= 0)
				break;
			/* This line continues. */
			if (p[len-nl-1] == '\\')
				multiline = 2;
		} else if (len > 6 && strncmp(p, "/unset", 6) == 0) {
			if (bid_keyword_list(p+6, len-6, 1, 0) <= 0)
				break;
			/* This line continues. */
			if (p[len-nl-1] == '\\')
				multiline = 2;
		} else
			break;

		/* Test next line. */
		p += len;
		avail -= len;
	}
	if (entry_cnt >= MAX_BID_ENTRY || (entry_cnt > 0 && len == 0)) {
		if (is_form_d != NULL) {
			if (form_D == 1)
				*is_form_d = 1;
		}
		return (32);
	}

	return (0);
}